

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall
dgPolyhedra::RefineTriangulation
          (dgPolyhedra *this,HaF64 *vertex,HaI32 stride,dgBigVector *normal,HaI32 perimeterCount,
          dgEdge **perimeter)

{
  double dVar1;
  double dVar2;
  int iVar3;
  dgEdge *pdVar4;
  double dVar5;
  undefined1 auVar6 [56];
  dgDiagonalEdge dVar7;
  dgDiagonalEdge dVar8;
  dgDiagonalEdge dVar9;
  dgDiagonalEdge dVar10;
  dgDiagonalEdge dVar11;
  dgDiagonalEdge dVar12;
  dgDiagonalEdge dVar13;
  dgDiagonalEdge dVar14;
  dgDiagonalEdge dVar15;
  dgDiagonalEdge dVar16;
  dgDiagonalEdge dVar17;
  dgDiagonalEdge dVar18;
  dgDiagonalEdge dVar19;
  dgDiagonalEdge dVar20;
  dgDiagonalEdge dVar21;
  dgDiagonalEdge dVar22;
  dgDiagonalEdge dVar23;
  dgDiagonalEdge dVar24;
  dgDiagonalEdge dVar25;
  dgDiagonalEdge dVar26;
  dgDiagonalEdge dVar27;
  dgDiagonalEdge dVar28;
  dgDiagonalEdge dVar29;
  dgDiagonalEdge dVar30;
  dgDiagonalEdge dVar31;
  dgDiagonalEdge dVar32;
  dgDiagonalEdge dVar33;
  dgDiagonalEdge dVar34;
  dgMatrix dVar35;
  dgMatrix dVar36;
  dgBigVector *pdVar37;
  HaI32 i;
  int iVar38;
  dgEdge *pdVar39;
  dgListNode *pdVar40;
  dgMatrix *pdVar41;
  dgTreeNode *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  double dVar47;
  dgEdge *pdVar48;
  dgEdge *pdVar49;
  HaF64 HVar50;
  undefined4 in_register_00000084;
  HaF64 *pHVar51;
  dgEdge *pdVar52;
  ulong uVar53;
  dgEdge *pdVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar65 [64];
  undefined1 auVar67 [64];
  undefined1 auVar69 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar71 [64];
  undefined1 auVar73 [64];
  undefined1 auVar75 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar81 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar98;
  double dVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  double dVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  dgDiagonalEdge key_1;
  dgList<dgDiagonalEdge> dignonals;
  dgDiagonalEdge key;
  HaF64 error;
  dgDiagonalEdge local_158;
  double local_150;
  double local_148;
  double local_140;
  ulong local_138;
  dgEdge **local_130;
  dgMatrix local_128;
  dgList<dgDiagonalEdge> local_e8;
  HaF64 *local_c8;
  dgPolyhedra *local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  _func_int **local_98;
  dgBigVector *local_90;
  undefined1 local_88 [16];
  HaF64 HStack_78;
  float fStack_70;
  float fStack_6c;
  double dStack_68;
  float fStack_60;
  float fStack_5c;
  undefined1 auStack_58 [16];
  undefined8 local_48;
  HaF64 local_38;
  undefined1 auVar66 [64];
  undefined1 auVar68 [64];
  undefined1 auVar70 [64];
  undefined1 auVar72 [64];
  undefined1 auVar74 [64];
  undefined1 auVar76 [64];
  undefined1 auVar78 [64];
  undefined1 auVar80 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  
  local_138 = CONCAT44(in_register_00000084,perimeterCount);
  local_150 = (double)CONCAT44(local_150._4_4_,stride);
  local_98 = (_func_int **)&PTR__dgList_00b6ab68;
  local_e8._vptr_dgList = (_func_int **)&PTR__dgList_00b6ab68;
  local_e8.m_count = 0;
  local_e8.m_last = (dgListNode *)0x0;
  local_e8.m_first = (dgListNode *)0x0;
  local_130 = perimeter;
  local_c8 = vertex;
  local_c0 = this;
  local_90 = normal;
  if (0 < perimeterCount) {
    uVar53 = 1;
    do {
      pdVar48 = local_130[uVar53 - 1];
      for (pdVar39 = local_130[uVar53]; pdVar39 = pdVar39->m_prev, pdVar39 != pdVar48;
          pdVar39 = pdVar39->m_twin) {
        if (local_e8.m_first != (dgListNode *)0x0) {
          pdVar40 = local_e8.m_first;
          do {
            iVar38 = (pdVar40->m_info).m_i0;
            if (((iVar38 == pdVar39->m_incidentVertex) &&
                ((pdVar40->m_info).m_i1 == pdVar39->m_twin->m_incidentVertex)) ||
               (((pdVar40->m_info).m_i1 == pdVar39->m_incidentVertex &&
                (iVar38 == pdVar39->m_twin->m_incidentVertex)))) goto LAB_0087f93b;
            pdVar40 = pdVar40->m_next;
          } while (pdVar40 != (dgListNode *)0x0);
        }
        local_88._0_4_ = pdVar39->m_incidentVertex;
        local_88._4_4_ = pdVar39->m_twin->m_incidentVertex;
        dgList<dgDiagonalEdge>::Append(&local_e8,(dgDiagonalEdge *)local_88);
LAB_0087f93b:
      }
      uVar53 = uVar53 + 1;
    } while (uVar53 != perimeterCount + 1);
  }
  pdVar37 = local_90;
  pHVar51 = local_c8;
  dVar20.m_i1 = local_88._4_4_;
  dVar20.m_i0 = local_88._0_4_;
  dVar19.m_i1 = local_88._4_4_;
  dVar19.m_i0 = local_88._0_4_;
  dVar18.m_i1 = local_88._4_4_;
  dVar18.m_i0 = local_88._0_4_;
  dVar17.m_i1 = local_88._4_4_;
  dVar17.m_i0 = local_88._0_4_;
  dVar16.m_i1 = local_88._4_4_;
  dVar16.m_i0 = local_88._0_4_;
  dVar15.m_i1 = local_88._4_4_;
  dVar15.m_i0 = local_88._0_4_;
  dVar14.m_i1 = local_88._4_4_;
  dVar14.m_i0 = local_88._0_4_;
  dVar13.m_i1 = local_88._4_4_;
  dVar13.m_i0 = local_88._0_4_;
  dVar12.m_i1 = local_88._4_4_;
  dVar12.m_i0 = local_88._0_4_;
  dVar11.m_i1 = local_88._4_4_;
  dVar11.m_i0 = local_88._0_4_;
  dVar10.m_i1 = local_88._4_4_;
  dVar10.m_i0 = local_88._0_4_;
  dVar9.m_i1 = local_88._4_4_;
  dVar9.m_i0 = local_88._0_4_;
  dVar8.m_i1 = local_88._4_4_;
  dVar8.m_i0 = local_88._0_4_;
  dVar7.m_i1 = local_88._4_4_;
  dVar7.m_i0 = local_88._0_4_;
  dVar47 = (double)(long)local_150._0_4_;
  lVar45 = (long)(*local_130)->m_incidentVertex * (long)dVar47;
  local_140 = (double)local_c8[lVar45];
  local_150 = (double)local_c8[lVar45 + 1];
  local_148 = (double)local_c8[lVar45 + 2];
  if ((((!NAN(local_148)) && (local_88._0_8_ = dVar7, (ulong)ABS(local_148) < 0x7ff0000000000000))
      && (local_88._0_8_ = dVar8, !NAN(local_150))) &&
     ((local_88._0_8_ = dVar9, (ulong)ABS(local_140) < 0x7ff0000000000000 &&
      (local_88._0_8_ = dVar10, (ulong)ABS(local_150) < 0x7ff0000000000000)))) {
    pdVar48 = (*local_130)->m_next;
    lVar45 = (long)pdVar48->m_incidentVertex * (long)dVar47;
    dVar99 = (double)local_c8[lVar45 + 1];
    dVar1 = (double)local_c8[lVar45 + 2];
    local_88._0_8_ = dVar11;
    if ((((!NAN(dVar1)) &&
         ((local_88._0_8_ = dVar12, (ulong)ABS(dVar1) < 0x7ff0000000000000 &&
          (local_88._0_8_ = dVar13, !NAN(dVar99))))) &&
        (local_88._0_8_ = dVar14, (ulong)ABS((double)local_c8[lVar45]) < 0x7ff0000000000000)) &&
       (local_88._0_8_ = dVar15, (ulong)ABS(dVar99) < 0x7ff0000000000000)) {
      dVar5 = (double)local_c8[lVar45] - local_140;
      dVar99 = dVar99 - local_150;
      dVar1 = dVar1 - local_148;
      if ((((long)ABS(dVar5) < 0x7ff0000000000000) && ((long)ABS(dVar99) < 0x7ff0000000000000)) &&
         ((long)ABS(dVar1) < 0x7ff0000000000000)) {
        auVar62._8_8_ = 0;
        auVar62._0_8_ = dVar5;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = dVar1;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = dVar99 * dVar99;
        auVar62 = vfmadd231sd_fma(auVar64,auVar62,auVar62);
        auVar62 = vfmadd231sd_fma(auVar62,auVar61,auVar61);
        dVar107 = auVar62._0_8_;
        while (dVar107 < 9.999999960041972e-13) {
          pdVar48 = pdVar48->m_next;
          lVar45 = (long)pdVar48->m_incidentVertex * (long)dVar47;
          dVar99 = (double)local_c8[lVar45 + 1];
          dVar1 = (double)local_c8[lVar45 + 2];
          local_88._0_8_ = dVar16;
          if (((NAN(dVar1)) || (local_88._0_8_ = dVar17, 0x7fefffffffffffff < (ulong)ABS(dVar1))) ||
             ((local_88._0_8_ = dVar18, NAN(dVar99) ||
              ((local_88._0_8_ = dVar19, 0x7fefffffffffffff < (ulong)ABS((double)local_c8[lVar45])
               || (local_88._0_8_ = dVar20, 0x7fefffffffffffff < (ulong)ABS(dVar99)))))))
          goto LAB_00880a5b;
          dVar5 = (double)local_c8[lVar45] - local_140;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = dVar5;
          dVar99 = dVar99 - local_150;
          dVar1 = dVar1 - local_148;
          if ((0x7fefffffffffffff < (long)ABS(dVar5)) ||
             ((0x7fefffffffffffff < (long)ABS(dVar99) || (0x7fefffffffffffff < (long)ABS(dVar1)))))
          goto LAB_00880ada;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = dVar1;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = dVar99 * dVar99;
          auVar62 = vfmadd231sd_fma(auVar56,auVar63,auVar63);
          auVar62 = vfmadd231sd_fma(auVar62,auVar57,auVar57);
          dVar107 = auVar62._0_8_;
        }
        local_b8 = dVar107;
        local_b0 = dVar1;
        local_a8 = dVar99;
        local_a0 = dVar5;
        pdVar41 = dgGetIdentityMatrix();
        dVar24.m_i1 = local_88._4_4_;
        dVar24.m_i0 = local_88._0_4_;
        dVar23.m_i1 = local_88._4_4_;
        dVar23.m_i0 = local_88._0_4_;
        dVar22.m_i1 = local_88._4_4_;
        dVar22.m_i0 = local_88._0_4_;
        dVar21.m_i1 = local_88._4_4_;
        dVar21.m_i0 = local_88._0_4_;
        auVar6._0_16_ = *(undefined1 (*) [16])&pdVar41->m_front;
        auVar6._16_16_ = *(undefined1 (*) [16])&pdVar41->m_up;
        auVar6._32_16_ = *(undefined1 (*) [16])&pdVar41->m_right;
        auVar6._48_4_ = (pdVar41->m_posit).super_dgTemplateVector<float>.m_x;
        auVar6._52_4_ = (pdVar41->m_posit).super_dgTemplateVector<float>.m_y;
        local_128 = *pdVar41;
        fVar91 = (float)local_150;
        fVar97 = (float)local_148;
        if ((((!NAN(fVar97)) && (local_88._0_8_ = dVar21, (uint)ABS(fVar97) < 0x7f800000)) &&
            (local_88._0_8_ = dVar22, !NAN(fVar91))) &&
           ((local_88._0_8_ = dVar23, (uint)ABS((float)local_140) < 0x7f800000 &&
            (local_88._0_8_ = dVar24, (uint)ABS(fVar91) < 0x7f800000)))) {
          local_128._0_48_ = auVar6._0_48_;
          local_128.m_posit.super_dgTemplateVector<float>.m_x = (float)local_140;
          local_128.m_posit.super_dgTemplateVector<float>.m_y = fVar91;
          local_128.m_posit.super_dgTemplateVector<float>.m_z = fVar97;
          local_128.m_posit.super_dgTemplateVector<float>.m_w = 0.0;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = local_b8;
          if (local_b8 < 0.0) {
            dVar99 = sqrt(local_b8);
          }
          else {
            auVar62 = vsqrtsd_avx(auVar58,auVar58);
            dVar99 = auVar62._0_8_;
          }
          dVar35 = local_128;
          dVar28.m_i1 = local_88._4_4_;
          dVar28.m_i0 = local_88._0_4_;
          dVar27.m_i1 = local_88._4_4_;
          dVar27.m_i0 = local_88._0_4_;
          dVar26.m_i1 = local_88._4_4_;
          dVar26.m_i0 = local_88._0_4_;
          dVar25.m_i1 = local_88._4_4_;
          dVar25.m_i0 = local_88._0_4_;
          dVar99 = 1.0 / dVar99;
          if (((0x7fefffffffffffff < (long)ABS(dVar99 * local_a0)) ||
              (0x7fefffffffffffff < (long)ABS(dVar99 * local_a8))) ||
             (0x7fefffffffffffff < (long)ABS(dVar99 * local_b0))) goto LAB_00880ada;
          fVar91 = (float)(dVar99 * local_a0);
          fVar97 = (float)(dVar99 * local_a8);
          fVar98 = (float)(dVar99 * local_b0);
          if (((((uint)ABS(fVar91) < 0x7f800000) &&
               (local_88._0_8_ = dVar25, (uint)ABS(fVar97) < 0x7f800000)) &&
              (local_88._0_8_ = dVar26, !NAN(fVar97))) &&
             ((local_88._0_8_ = dVar27, (uint)ABS(fVar98) < 0x7f800000 &&
              (local_88._0_8_ = dVar28, !NAN(fVar98))))) {
            local_128.m_front.super_dgTemplateVector<float>.m_y = fVar97;
            local_128.m_front.super_dgTemplateVector<float>.m_x = fVar91;
            local_128.m_front.super_dgTemplateVector<float>.m_z = fVar98;
            local_128._16_48_ = dVar35._16_48_;
            local_128.m_front.super_dgTemplateVector<float>.m_w = 0.0;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = (pdVar37->super_dgTemplateVector<double>).m_x;
            dVar99 = (pdVar37->super_dgTemplateVector<double>).m_y;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = dVar99 * dVar99;
            auVar62 = vfmadd231sd_fma(auVar92,auVar59,auVar59);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = (pdVar37->super_dgTemplateVector<double>).m_z;
            auVar62 = vfmadd213sd_fma(auVar60,auVar60,auVar62);
            if (auVar62._0_8_ < 0.0) {
              dVar99 = sqrt(auVar62._0_8_);
            }
            else {
              auVar62 = vsqrtsd_avx(auVar62,auVar62);
              dVar99 = auVar62._0_8_;
            }
            dVar35 = local_128;
            dVar34.m_i1 = local_88._4_4_;
            dVar34.m_i0 = local_88._0_4_;
            dVar33.m_i1 = local_88._4_4_;
            dVar33.m_i0 = local_88._0_4_;
            dVar32.m_i1 = local_88._4_4_;
            dVar32.m_i0 = local_88._0_4_;
            dVar31.m_i1 = local_88._4_4_;
            dVar31.m_i0 = local_88._0_4_;
            dVar30.m_i1 = local_88._4_4_;
            dVar30.m_i0 = local_88._0_4_;
            dVar29.m_i1 = local_88._4_4_;
            dVar29.m_i0 = local_88._0_4_;
            dVar99 = 1.0 / dVar99;
            dVar5 = dVar99 * (pdVar37->super_dgTemplateVector<double>).m_x;
            dVar107 = dVar99 * (pdVar37->super_dgTemplateVector<double>).m_y;
            dVar99 = dVar99 * (pdVar37->super_dgTemplateVector<double>).m_z;
            dVar1 = (pdVar37->super_dgTemplateVector<double>).m_w;
            if (((0x7fefffffffffffff < (long)ABS(dVar5)) ||
                (0x7fefffffffffffff < (long)ABS(dVar107))) ||
               ((0x7fefffffffffffff < (long)ABS(dVar99) || (0x7fefffffffffffff < (ulong)ABS(dVar1)))
               )) goto LAB_00880ada;
            auVar93._0_4_ = (float)dVar5;
            auVar93._4_4_ = (int)((ulong)dVar5 >> 0x20);
            auVar93._8_8_ = 0;
            auVar100._0_4_ = (float)dVar107;
            auVar100._4_4_ = (int)((ulong)dVar107 >> 0x20);
            auVar100._8_8_ = 0;
            auVar103._0_4_ = (float)dVar99;
            auVar103._4_4_ = (int)((ulong)dVar99 >> 0x20);
            auVar103._8_8_ = 0;
            auVar88._0_4_ = (float)dVar1;
            auVar88._4_4_ = (int)((ulong)dVar1 >> 0x20);
            auVar88._8_8_ = 0;
            if (((((uint)ABS(auVar93._0_4_) < 0x7f800000) &&
                 (local_88._0_8_ = dVar29, (uint)ABS(auVar100._0_4_) < 0x7f800000)) &&
                (local_88._0_8_ = dVar30, !NAN(auVar100._0_4_))) &&
               (((local_88._0_8_ = dVar31, (uint)ABS(auVar103._0_4_) < 0x7f800000 &&
                 (local_88._0_8_ = dVar32, !NAN(auVar103._0_4_))) &&
                ((local_88._0_8_ = dVar33, (uint)ABS(auVar88._0_4_) < 0x7f800000 &&
                 (local_88._0_8_ = dVar34, !NAN(auVar88._0_4_))))))) {
              local_128.m_right.super_dgTemplateVector<float>.m_x = auVar93._0_4_;
              local_128.m_right.super_dgTemplateVector<float>.m_y = auVar100._0_4_;
              local_128.m_right.super_dgTemplateVector<float>.m_z = auVar103._0_4_;
              local_128.m_posit = dVar35.m_posit.super_dgTemplateVector<float>;
              local_128.m_right.super_dgTemplateVector<float>.m_w = auVar88._0_4_;
              dVar36 = local_128;
              local_128.m_front.super_dgTemplateVector<float>.m_z =
                   dVar35.m_front.super_dgTemplateVector<float>.m_z;
              local_128.m_front.super_dgTemplateVector<float>.m_x =
                   dVar35.m_front.super_dgTemplateVector<float>.m_x;
              local_128.m_front.super_dgTemplateVector<float>.m_y =
                   dVar35.m_front.super_dgTemplateVector<float>.m_y;
              auVar62 = vfmsub231ss_fma(ZEXT416((uint)(local_128.m_front.
                                                       super_dgTemplateVector<float>.m_y *
                                                      auVar103._0_4_)),auVar100,
                                        ZEXT416((uint)local_128.m_front.
                                                      super_dgTemplateVector<float>.m_z));
              auVar61 = vfmsub231ss_fma(ZEXT416((uint)(local_128.m_front.
                                                       super_dgTemplateVector<float>.m_z *
                                                      auVar93._0_4_)),
                                        ZEXT416((uint)local_128.m_front.
                                                      super_dgTemplateVector<float>.m_x),auVar103);
              auVar64 = vfmsub231ss_fma(ZEXT416((uint)(local_128.m_front.
                                                       super_dgTemplateVector<float>.m_x *
                                                      auVar100._0_4_)),auVar93,
                                        ZEXT416((uint)local_128.m_front.
                                                      super_dgTemplateVector<float>.m_y));
              if (((0x7f7fffff < (auVar62._0_4_ & 0x7fffffff)) ||
                  (0x7f7fffff < (auVar61._0_4_ & 0x7fffffff))) ||
                 (0x7f7fffff < (auVar64._0_4_ & 0x7fffffff))) {
                local_128 = dVar36;
                __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                              ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
              }
              auVar64 = vinsertps_avx(auVar64,auVar88,0x10);
              auVar62 = vinsertps_avx(auVar62,auVar61,0x10);
              auVar62 = vmovlhps_avx(auVar62,auVar64);
              local_128._32_32_ = dVar36._32_32_;
              local_128.m_front = dVar35.m_front.super_dgTemplateVector<float>;
              local_128.m_up.super_dgTemplateVector<float>.m_x = (float)auVar62._0_4_;
              local_128.m_up.super_dgTemplateVector<float>.m_y = (float)auVar62._4_4_;
              local_128.m_up.super_dgTemplateVector<float>.m_z = (float)auVar62._8_4_;
              local_128.m_up.super_dgTemplateVector<float>.m_w = (float)auVar62._12_4_;
              local_140 = dVar47;
              dgMatrix::Inverse((dgMatrix *)local_88,&local_128);
              auVar87._8_8_ = local_88._8_8_;
              auVar87._0_4_ = local_88._0_4_;
              auVar87._4_4_ = local_88._4_4_;
              auVar87._16_8_ = HStack_78;
              auVar87._24_4_ = fStack_70;
              auVar87._28_4_ = fStack_6c;
              auVar87._32_8_ = dStack_68;
              auVar87._40_4_ = fStack_60;
              auVar87._44_4_ = fStack_5c;
              auVar87._48_8_ = auStack_58._0_8_;
              auVar87._56_8_ = auStack_58._8_8_;
              local_128._0_60_ = auVar87._0_60_;
              local_128.m_posit.super_dgTemplateVector<float>.m_w = 1.0;
              if (local_e8.m_count != 0) {
                iVar38 = local_e8.m_count * local_e8.m_count;
                local_148 = (double)(local_138 & 0xffffffff);
                pdVar48 = (dgEdge *)0x0;
                do {
                  pdVar40 = local_e8.m_first;
                  local_150 = (double)CONCAT44(local_150._4_4_,iVar38);
                  iVar38 = ((local_e8.m_first)->m_info).m_i0;
                  iVar3 = ((local_e8.m_first)->m_info).m_i1;
                  dgList<dgDiagonalEdge>::Unlink(&local_e8,local_e8.m_first);
                  if (pdVar40 != (dgListNode *)0x0) {
                    (*pdVar40->_vptr_dgListNode[1])(pdVar40);
                  }
                  pdVar42 = (local_c0->super_dgTree<dgEdge,_long>).m_head;
                  if (pdVar42 == (dgTreeNode *)0x0) {
                    pdVar42 = (dgTreeNode *)0x0;
                  }
                  else {
                    uVar53 = (long)iVar38 << 0x20 | (long)iVar3;
                    do {
                      lVar45 = 8;
                      if ((pdVar42->m_key <= (long)uVar53) &&
                         (lVar45 = 0x10, (long)uVar53 <= pdVar42->m_key)) break;
                      pdVar42 = *(dgTreeNode **)
                                 ((long)&(pdVar42->super_dgRedBackNode)._vptr_dgRedBackNode + lVar45
                                 );
                    } while (pdVar42 != (dgTreeNode *)0x0);
                  }
                  if (pdVar42 != (dgTreeNode *)0x0) {
                    lVar45 = (long)(pdVar42->m_info).m_incidentVertex * (long)local_140;
                    dVar47 = (double)pHVar51[lVar45];
                    dVar99 = (double)pHVar51[lVar45 + 1];
                    dVar1 = (double)pHVar51[lVar45 + 2];
                    if ((((NAN(dVar1)) || (0x7fefffffffffffff < (ulong)ABS(dVar1))) || (NAN(dVar99))
                        ) || ((0x7fefffffffffffff < (ulong)ABS(dVar47) ||
                              (0x7fefffffffffffff < (ulong)ABS(dVar99))))) goto LAB_00880a5b;
                    pdVar39 = (pdVar42->m_info).m_next;
                    lVar45 = (long)pdVar39->m_incidentVertex * (long)local_140;
                    HVar50 = (HaF64)ABS((double)pHVar51[lVar45 + 2]);
                    uVar53 = (long)HVar50 + 0x8010000000000001;
                    auVar115._8_8_ = 0;
                    auVar115._0_8_ = pHVar51[lVar45 + 2];
                    auVar62 = vucomisd_avx512f(auVar115);
                    if (((((POPCOUNT(uVar53 & 0xff) & 1U) == 0) ||
                         ((uVar53 != 0 && 0x7feffffffffffffe < (ulong)HVar50 ||
                          (auVar113._8_8_ = 0, auVar113._0_8_ = pHVar51[lVar45 + 1],
                          auVar61 = vucomisd_avx512f(auVar113),
                          uVar53 == 0 || 0x7feffffffffffffe >= (ulong)HVar50)))) ||
                        (0x7fefffffffffffff < (ulong)ABS((double)pHVar51[lVar45]))) ||
                       (0x7fefffffffffffff < (ulong)ABS((double)pHVar51[lVar45 + 1])))
                    goto LAB_00880a5b;
                    lVar43 = (long)pdVar39->m_next->m_incidentVertex * (long)local_140;
                    HVar50 = (HaF64)ABS((double)pHVar51[lVar43 + 2]);
                    uVar53 = (long)HVar50 + 0x8010000000000001;
                    auVar112._8_8_ = 0;
                    auVar112._0_8_ = pHVar51[lVar43 + 2];
                    auVar64 = vucomisd_avx512f(auVar112);
                    if (((((POPCOUNT(uVar53 & 0xff) & 1U) == 0) ||
                         (uVar53 != 0 && 0x7feffffffffffffe < (ulong)HVar50)) ||
                        (auVar110._8_8_ = 0, auVar110._0_8_ = pHVar51[lVar43 + 1],
                        auVar63 = vucomisd_avx512f(auVar110),
                        uVar53 == 0 || 0x7feffffffffffffe >= (ulong)HVar50)) ||
                       ((0x7fefffffffffffff < (ulong)ABS((double)pHVar51[lVar43]) ||
                        (0x7fefffffffffffff < (ulong)ABS((double)pHVar51[lVar43 + 1])))))
                    goto LAB_00880a5b;
                    lVar44 = (long)((pdVar42->m_info).m_twin)->m_prev->m_incidentVertex *
                             (long)local_140;
                    dVar5 = (double)pHVar51[lVar44];
                    dVar107 = (double)pHVar51[lVar44 + 1];
                    dVar2 = (double)pHVar51[lVar44 + 2];
                    if (((NAN(dVar2)) ||
                        ((0x7fefffffffffffff < (ulong)ABS(dVar2) || (NAN(dVar107))))) ||
                       ((0x7fefffffffffffff < (ulong)ABS(dVar5) ||
                        (0x7fefffffffffffff < (ulong)ABS(dVar107))))) goto LAB_00880a5b;
                    auVar108._0_4_ = (float)dVar47;
                    auVar108._4_4_ = (int)((ulong)dVar47 >> 0x20);
                    auVar108._8_8_ = 0;
                    auVar109._0_4_ = (float)dVar99;
                    auVar109._4_4_ = (int)((ulong)dVar99 >> 0x20);
                    auVar109._8_8_ = 0;
                    auVar104._0_4_ = (float)dVar1;
                    auVar104._4_4_ = (int)((ulong)dVar1 >> 0x20);
                    auVar104._8_8_ = 0;
                    if ((((NAN(auVar104._0_4_)) || (0x7f7fffff < (uint)ABS(auVar104._0_4_))) ||
                        (NAN(auVar109._0_4_))) ||
                       ((0x7f7fffff < (uint)ABS(auVar108._0_4_) ||
                        (0x7f7fffff < (uint)ABS(auVar109._0_4_))))) goto LAB_00880a7a;
                    auVar57 = vfmadd231ss_fma(ZEXT416((uint)(local_128.m_up.
                                                             super_dgTemplateVector<float>.m_x *
                                                            auVar109._0_4_)),auVar108,
                                              ZEXT416((uint)local_128.m_front.
                                                            super_dgTemplateVector<float>.m_x));
                    auVar57 = vfmadd231ss_fma(auVar57,auVar104,
                                              ZEXT416((uint)local_128.m_right.
                                                            super_dgTemplateVector<float>.m_x));
                    auVar66._16_48_ = auVar87._16_48_;
                    auVar56 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_x),
                                             auVar57);
                    auVar57 = vfmadd231ss_fma(ZEXT416((uint)(local_128.m_up.
                                                             super_dgTemplateVector<float>.m_y *
                                                            auVar109._0_4_)),auVar108,
                                              ZEXT416((uint)local_128.m_front.
                                                            super_dgTemplateVector<float>.m_y));
                    auVar57 = vfmadd231ss_fma(auVar57,auVar104,
                                              ZEXT416((uint)local_128.m_right.
                                                            super_dgTemplateVector<float>.m_y));
                    auVar57 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_y),
                                             auVar57);
                    auVar58 = vmulss_avx512f(ZEXT416((uint)local_128.m_up.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar109);
                    auVar58 = vfmadd231ss_avx512f(auVar58,ZEXT416((uint)local_128.m_front.
                                                                                                                                                
                                                  super_dgTemplateVector<float>.m_z),auVar108);
                    auVar58 = vfmadd231ss_avx512f(auVar58,ZEXT416((uint)local_128.m_right.
                                                                                                                                                
                                                  super_dgTemplateVector<float>.m_z),auVar104);
                    auVar58 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar58);
                    fVar91 = auVar58._0_4_;
                    if (((NAN(fVar91)) ||
                        ((auVar58 = vucomiss_avx512f(auVar57), NAN(fVar91) ||
                         (0x7f7fffff < (auVar56._0_4_ & 0x7fffffff))))) ||
                       ((0x7f7fffff < (auVar57._0_4_ & 0x7fffffff) ||
                        (0x7f7fffff < (uint)ABS(fVar91))))) {
LAB_00880abb:
                      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                    ,0x134,
                                    "dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)"
                                   );
                    }
                    auVar57 = vcvtss2sd_avx512f(auVar56,auVar56);
                    auVar58 = vcvtss2sd_avx512f(auVar58,auVar58);
                    dVar47 = ABS(auVar57._0_8_);
                    uVar53 = (long)dVar47 + 0x8010000000000001;
                    if ((((uVar53 != 0 && 0x7feffffffffffffe < (ulong)dVar47) ||
                         (vucomiss_avx512f(auVar56), (POPCOUNT(uVar53 & 0xff) & 1U) == 0)) ||
                        (0x7fefffffffffffff < (ulong)ABS(auVar58._0_8_))) ||
                       (0x7f7fffff < (uint)ABS(fVar91))) {
LAB_00880a9c:
                      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                    ,0x13f,"dgBigVector::dgBigVector(const dgVector &)");
                    }
                    auVar114._8_8_ = 0;
                    auVar114._0_8_ = pHVar51[lVar45];
                    auVar66._0_16_ = vcvtsd2ss_avx512f(auVar114,auVar114);
                    auVar65._0_4_ = auVar66._0_4_;
                    auVar65._4_60_ = auVar66._4_60_;
                    auVar56 = auVar65._0_16_;
                    auVar68._0_16_ = vcvtsd2ss_avx512f(auVar61,auVar61);
                    auVar68._16_48_ = auVar66._16_48_;
                    auVar67._0_4_ = auVar68._0_4_;
                    auVar67._4_60_ = auVar68._4_60_;
                    auVar70._0_16_ = vcvtsd2ss_avx512f(auVar62,auVar62);
                    auVar70._16_48_ = auVar66._16_48_;
                    auVar69._0_4_ = auVar70._0_4_;
                    auVar69._4_60_ = auVar70._4_60_;
                    uVar46 = auVar69._0_4_ & 0x7fffffff;
                    auVar62 = vucomiss_avx512f(auVar69._0_16_);
                    if ((((POPCOUNT(uVar46 + 0x80800000 & 0xff) & 1U) == 0) || (0x7f7fffff < uVar46)
                        ) || ((auVar61 = vucomiss_avx512f(auVar67._0_16_), 0x7f7fffff >= uVar46 ||
                              ((0x7f7fffff < (auVar65._0_4_ & 0x7fffffff) ||
                               (0x7f7fffff < (auVar67._0_4_ & 0x7fffffff))))))) goto LAB_00880a7a;
                    auVar92 = ZEXT416((uint)local_128.m_up.super_dgTemplateVector<float>.m_x);
                    auVar59 = vmulss_avx512f(auVar92,auVar61);
                    auVar59 = vfmadd231ss_avx512f(auVar59,auVar56,
                                                  ZEXT416((uint)local_128.m_front.
                                                                super_dgTemplateVector<float>.m_x));
                    auVar59 = vfmadd231ss_avx512f(auVar59,auVar62,
                                                  ZEXT416((uint)local_128.m_right.
                                                                super_dgTemplateVector<float>.m_x));
                    auVar59 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_x),
                                             auVar59);
                    auVar88 = ZEXT416((uint)local_128.m_up.super_dgTemplateVector<float>.m_y);
                    auVar60 = vmulss_avx512f(auVar88,auVar61);
                    auVar60 = vfmadd231ss_avx512f(auVar60,auVar56,
                                                  ZEXT416((uint)local_128.m_front.
                                                                super_dgTemplateVector<float>.m_y));
                    auVar60 = vfmadd231ss_avx512f(auVar60,auVar62,
                                                  ZEXT416((uint)local_128.m_right.
                                                                super_dgTemplateVector<float>.m_y));
                    auVar60 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_y),
                                             auVar60);
                    auVar61 = vmulss_avx512f(ZEXT416((uint)local_128.m_up.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar61);
                    auVar61 = vfmadd231ss_avx512f(auVar61,ZEXT416((uint)local_128.m_front.
                                                                                                                                                
                                                  super_dgTemplateVector<float>.m_z),auVar56);
                    auVar62 = vfmadd231ss_avx512f(auVar61,ZEXT416((uint)local_128.m_right.
                                                                                                                                                
                                                  super_dgTemplateVector<float>.m_z),auVar62);
                    auVar62 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar62);
                    uVar46 = auVar62._0_4_ & 0x7fffffff;
                    bVar55 = (POPCOUNT(uVar46 + 0x80800000 & 0xff) & 1U) == 0;
                    vucomiss_avx512f(auVar62);
                    if ((bVar55) ||
                       ((((auVar61 = vucomiss_avx512f(auVar60), bVar55 ||
                          (0x7f7fffff < (auVar59._0_4_ & 0x7fffffff))) ||
                         (0x7f7fffff < (auVar60._0_4_ & 0x7fffffff))) || (0x7f7fffff < uVar46))))
                    goto LAB_00880abb;
                    auVar72._0_16_ = vcvtss2sd_avx512f(auVar59,auVar59);
                    auVar72._16_48_ = auVar66._16_48_;
                    auVar71._0_8_ = auVar72._0_8_;
                    auVar71._8_56_ = auVar72._8_56_;
                    auVar74._0_16_ = vcvtss2sd_avx512f(auVar61,auVar61);
                    auVar74._16_48_ = auVar66._16_48_;
                    auVar73._0_8_ = auVar74._0_8_;
                    auVar73._8_56_ = auVar74._8_56_;
                    uVar53 = (auVar71._0_8_ & 0x7fffffffffffffff) + 0x8010000000000001;
                    if (((uVar53 != 0 && 0x7feffffffffffffe < (auVar71._0_8_ & 0x7fffffffffffffff))
                        || (vucomiss_avx512f(auVar59), (POPCOUNT(uVar53 & 0xff) & 1U) == 0)) ||
                       ((0x7fefffffffffffff < (auVar73._0_8_ & 0x7fffffffffffffff) ||
                        (0x7f7fffff < (auVar62._0_4_ & 0x7fffffff))))) goto LAB_00880a9c;
                    auVar111._8_8_ = 0;
                    auVar111._0_8_ = pHVar51[lVar43];
                    auVar76._0_16_ = vcvtsd2ss_avx512f(auVar111,auVar111);
                    auVar76._16_48_ = auVar66._16_48_;
                    auVar75._0_4_ = auVar76._0_4_;
                    auVar75._4_60_ = auVar76._4_60_;
                    auVar61 = auVar75._0_16_;
                    auVar78._0_16_ = vcvtsd2ss_avx512f(auVar63,auVar63);
                    auVar78._16_48_ = auVar66._16_48_;
                    auVar77._0_4_ = auVar78._0_4_;
                    auVar77._4_60_ = auVar78._4_60_;
                    auVar80._0_16_ = vcvtsd2ss_avx512f(auVar64,auVar64);
                    auVar80._16_48_ = auVar66._16_48_;
                    auVar79._0_4_ = auVar80._0_4_;
                    auVar79._4_60_ = auVar80._4_60_;
                    uVar46 = auVar79._0_4_ & 0x7fffffff;
                    auVar62 = vucomiss_avx512f(auVar79._0_16_);
                    if (((((POPCOUNT(uVar46 + 0x80800000 & 0xff) & 1U) == 0) ||
                         (0x7f7fffff < uVar46)) ||
                        (auVar64 = vucomiss_avx512f(auVar77._0_16_), 0x7f7fffff >= uVar46)) ||
                       ((0x7f7fffff < (auVar75._0_4_ & 0x7fffffff) ||
                        (0x7f7fffff < (auVar77._0_4_ & 0x7fffffff))))) goto LAB_00880a7a;
                    auVar63 = vmulss_avx512f(auVar92,auVar64);
                    auVar63 = vfmadd231ss_avx512f(auVar63,auVar61,
                                                  ZEXT416((uint)local_128.m_front.
                                                                super_dgTemplateVector<float>.m_x));
                    auVar63 = vfmadd231ss_avx512f(auVar63,auVar62,
                                                  ZEXT416((uint)local_128.m_right.
                                                                super_dgTemplateVector<float>.m_x));
                    auVar63 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_x),
                                             auVar63);
                    auVar56 = vmulss_avx512f(auVar88,auVar64);
                    auVar56 = vfmadd231ss_avx512f(auVar56,auVar61,
                                                  ZEXT416((uint)local_128.m_front.
                                                                super_dgTemplateVector<float>.m_y));
                    auVar56 = vfmadd231ss_avx512f(auVar56,auVar62,
                                                  ZEXT416((uint)local_128.m_right.
                                                                super_dgTemplateVector<float>.m_y));
                    auVar56 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_y),
                                             auVar56);
                    auVar64 = vmulss_avx512f(ZEXT416((uint)local_128.m_up.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar64);
                    auVar61 = vfmadd231ss_avx512f(auVar64,ZEXT416((uint)local_128.m_front.
                                                                                                                                                
                                                  super_dgTemplateVector<float>.m_z),auVar61);
                    auVar62 = vfmadd231ss_avx512f(auVar61,ZEXT416((uint)local_128.m_right.
                                                                                                                                                
                                                  super_dgTemplateVector<float>.m_z),auVar62);
                    auVar62 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar62);
                    uVar46 = auVar62._0_4_ & 0x7fffffff;
                    bVar55 = (POPCOUNT(uVar46 + 0x80800000 & 0xff) & 1U) == 0;
                    vucomiss_avx512f(auVar62);
                    if (((bVar55) ||
                        (((auVar61 = vucomiss_avx512f(auVar56), bVar55 ||
                          (0x7f7fffff < (auVar63._0_4_ & 0x7fffffff))) ||
                         (0x7f7fffff < (auVar56._0_4_ & 0x7fffffff))))) || (0x7f7fffff < uVar46))
                    goto LAB_00880abb;
                    auVar82._0_16_ = vcvtss2sd_avx512f(auVar63,auVar63);
                    auVar82._16_48_ = auVar66._16_48_;
                    auVar81._0_8_ = auVar82._0_8_;
                    auVar81._8_56_ = auVar82._8_56_;
                    auVar84._0_16_ = vcvtss2sd_avx512f(auVar61,auVar61);
                    auVar84._16_48_ = auVar66._16_48_;
                    auVar83._0_8_ = auVar84._0_8_;
                    auVar83._8_56_ = auVar84._8_56_;
                    uVar53 = (auVar81._0_8_ & 0x7fffffffffffffff) + 0x8010000000000001;
                    if (((uVar53 != 0 && 0x7feffffffffffffe < (auVar81._0_8_ & 0x7fffffffffffffff))
                        || (vucomiss_avx512f(auVar63), (POPCOUNT(uVar53 & 0xff) & 1U) == 0)) ||
                       ((0x7fefffffffffffff < (auVar83._0_8_ & 0x7fffffffffffffff) ||
                        (0x7f7fffff < (auVar62._0_4_ & 0x7fffffff))))) goto LAB_00880a9c;
                    auVar94._0_4_ = (float)dVar5;
                    auVar94._4_4_ = (int)((ulong)dVar5 >> 0x20);
                    auVar94._8_8_ = 0;
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = dVar107;
                    auVar86._0_16_ = vcvtsd2ss_avx512f(auVar89,auVar89);
                    auVar86._16_48_ = auVar66._16_48_;
                    auVar85._0_4_ = auVar86._0_4_;
                    auVar85._4_60_ = auVar86._4_60_;
                    auVar101._0_4_ = (float)dVar2;
                    auVar101._4_4_ = (int)((ulong)dVar2 >> 0x20);
                    auVar101._8_8_ = 0;
                    if ((((NAN(auVar101._0_4_)) || (0x7f7fffff < (uint)ABS(auVar101._0_4_))) ||
                        (auVar62 = vucomiss_avx512f(auVar85._0_16_),
                        0x7f7fffff >= (uint)ABS(auVar101._0_4_))) ||
                       ((0x7f7fffff < (uint)ABS(auVar94._0_4_) ||
                        (0x7f7fffff < (auVar85._0_4_ & 0x7fffffff))))) goto LAB_00880a7a;
                    auVar61 = vmulss_avx512f(auVar92,auVar62);
                    auVar61 = vfmadd213ss_fma(ZEXT416((uint)local_128.m_front.
                                                            super_dgTemplateVector<float>.m_x),
                                              auVar94,auVar61);
                    auVar61 = vfmadd213ss_fma(ZEXT416((uint)local_128.m_right.
                                                            super_dgTemplateVector<float>.m_x),
                                              auVar101,auVar61);
                    fVar91 = local_128.m_posit.super_dgTemplateVector<float>.m_x + auVar61._0_4_;
                    auVar61 = vmulss_avx512f(auVar88,auVar62);
                    auVar61 = vfmadd213ss_fma(ZEXT416((uint)local_128.m_front.
                                                            super_dgTemplateVector<float>.m_y),
                                              auVar94,auVar61);
                    auVar61 = vfmadd213ss_fma(ZEXT416((uint)local_128.m_right.
                                                            super_dgTemplateVector<float>.m_y),
                                              auVar101,auVar61);
                    fVar97 = local_128.m_posit.super_dgTemplateVector<float>.m_y + auVar61._0_4_;
                    auVar62 = vmulss_avx512f(ZEXT416((uint)local_128.m_up.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar62);
                    auVar62 = vfmadd213ss_fma(ZEXT416((uint)local_128.m_front.
                                                            super_dgTemplateVector<float>.m_z),
                                              auVar94,auVar62);
                    auVar62 = vfmadd213ss_fma(ZEXT416((uint)local_128.m_right.
                                                            super_dgTemplateVector<float>.m_z),
                                              auVar101,auVar62);
                    auVar62 = vaddss_avx512f(ZEXT416((uint)local_128.m_posit.
                                                           super_dgTemplateVector<float>.m_z),
                                             auVar62);
                    fVar98 = auVar62._0_4_;
                    if (((NAN(fVar98)) ||
                        (((NAN(fVar97) || (0x7f7fffff < (uint)ABS(fVar91))) ||
                         (0x7f7fffff < (uint)ABS(fVar97))))) || (0x7f7fffff < (uint)ABS(fVar98)))
                    goto LAB_00880abb;
                    auVar95._0_8_ = (double)fVar91;
                    auVar95._8_8_ = 0;
                    auVar102._0_8_ = (double)fVar97;
                    auVar102._8_8_ = 0;
                    if (((0x7fefffffffffffff < (long)ABS(auVar95._0_8_)) || (NAN(fVar91))) ||
                       ((0x7fefffffffffffff < (long)ABS(auVar102._0_8_) ||
                        (0x7f7fffff < (uint)ABS(fVar98))))) goto LAB_00880a9c;
                    local_88._0_8_ = auVar57._0_8_ - auVar95._0_8_;
                    local_88._8_8_ = auVar58._0_8_ - auVar102._0_8_;
                    auVar90._8_8_ = 0;
                    auVar90._0_4_ = (HaI32)local_88._0_8_;
                    auVar90._4_4_ = SUB84(local_88._0_8_,4);
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = (double)local_88._8_8_ * (double)local_88._8_8_;
                    auVar62 = vfmadd231sd_fma(auVar105,auVar90,auVar90);
                    HStack_78 = auVar62._0_8_;
                    auVar62 = vsubsd_avx512f(auVar71._0_16_,auVar95);
                    _fStack_70 = auVar62._0_8_;
                    auVar61 = vsubsd_avx512f(auVar73._0_16_,auVar102);
                    dStack_68 = auVar61._0_8_;
                    auVar106._8_8_ = 0;
                    auVar106._0_8_ = dStack_68 * dStack_68;
                    auVar62 = vfmadd231sd_fma(auVar106,auVar62,auVar62);
                    _fStack_60 = auVar62._0_8_;
                    auVar62 = vsubsd_avx512f(auVar81._0_16_,auVar95);
                    auStack_58._0_8_ = auVar62._0_8_;
                    auVar87._0_16_ = vsubsd_avx512f(auVar83._0_16_,auVar102);
                    auVar87._16_48_ = auVar66._16_48_;
                    auStack_58._8_8_ = auVar87._0_8_;
                    auVar96._8_8_ = 0;
                    auVar96._0_8_ = (double)auStack_58._8_8_ * (double)auStack_58._8_8_;
                    auVar62 = vfmadd231sd_fma(auVar96,auVar62,auVar62);
                    local_48 = auVar62._0_8_;
                    HVar50 = Determinant3x3((HaF64 (*) [3])local_88,&local_38);
                    pHVar51 = local_c8;
                    if ((double)HVar50 < 0.0) {
                      pdVar39 = (pdVar42->m_info).m_prev;
                      pdVar52 = ((pdVar42->m_info).m_twin)->m_prev;
                      FlipEdge(local_c0,&pdVar42->m_info);
                      pHVar51 = local_c8;
                      if (4 < (int)local_138) {
                        pdVar54 = pdVar52->m_next;
                        pdVar49 = pdVar39->m_next;
                        dVar47 = 0.0;
                        do {
                          pdVar4 = local_130[(long)dVar47];
                          if (pdVar39 == pdVar4) {
                            pdVar39 = pdVar48;
                          }
                          if (pdVar49 == pdVar4) {
                            pdVar49 = pdVar48;
                          }
                          if (pdVar52 == pdVar4) {
                            pdVar52 = pdVar48;
                          }
                          if (pdVar54 == pdVar4) {
                            pdVar54 = pdVar48;
                          }
                          dVar47 = (double)((long)dVar47 + 1);
                        } while (local_148 != dVar47);
                        if (((pdVar52 != (dgEdge *)0x0) && (0 < pdVar52->m_incidentFace)) &&
                           (0 < pdVar52->m_twin->m_incidentFace)) {
                          local_158.m_i0 = pdVar52->m_incidentVertex;
                          local_158.m_i1 = pdVar52->m_twin->m_incidentVertex;
                          dgList<dgDiagonalEdge>::Append(&local_e8,&local_158);
                        }
                        if (((pdVar54 != (dgEdge *)0x0) && (0 < pdVar54->m_incidentFace)) &&
                           (0 < pdVar54->m_twin->m_incidentFace)) {
                          local_158.m_i0 = pdVar54->m_incidentVertex;
                          local_158.m_i1 = pdVar54->m_twin->m_incidentVertex;
                          dgList<dgDiagonalEdge>::Append(&local_e8,&local_158);
                        }
                        if (((pdVar39 != (dgEdge *)0x0) && (0 < pdVar39->m_incidentFace)) &&
                           (0 < pdVar39->m_twin->m_incidentFace)) {
                          local_158.m_i0 = pdVar39->m_incidentVertex;
                          local_158.m_i1 = pdVar39->m_twin->m_incidentVertex;
                          dgList<dgDiagonalEdge>::Append(&local_e8,&local_158);
                        }
                        pHVar51 = local_c8;
                        if (((pdVar49 != (dgEdge *)0x0) && (0 < pdVar49->m_incidentFace)) &&
                           (0 < pdVar49->m_twin->m_incidentFace)) {
                          local_158.m_i0 = pdVar49->m_incidentVertex;
                          local_158.m_i1 = pdVar49->m_twin->m_incidentVertex;
                          dgList<dgDiagonalEdge>::Append(&local_e8,&local_158);
                          pHVar51 = local_c8;
                        }
                      }
                    }
                  }
                } while ((local_e8.m_count != 0) && (iVar38 = local_150._0_4_ + -1, iVar38 != 0));
              }
              local_e8._vptr_dgList = local_98;
              dgList<dgDiagonalEdge>::RemoveAll(&local_e8);
              return;
            }
          }
        }
LAB_00880a7a:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x12d,"dgVector::dgVector(const dgBigVector &)");
      }
LAB_00880ada:
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
    }
  }
LAB_00880a5b:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void dgPolyhedra::RefineTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 stride, dgBigVector* const normal, hacd::HaI32 perimeterCount, dgEdge** const perimeter)
{
	dgList<dgDiagonalEdge> dignonals;

	for (hacd::HaI32 i = 1; i <= perimeterCount; i ++) {
		dgEdge* const last = perimeter[i - 1];
		for (dgEdge* ptr = perimeter[i]->m_prev; ptr != last; ptr = ptr->m_twin->m_prev) {
			dgList<dgDiagonalEdge>::dgListNode* node = dignonals.GetFirst();
			for (; node; node = node->GetNext()) {
				const dgDiagonalEdge& key = node->GetInfo();
				if (((key.m_i0 == ptr->m_incidentVertex) && (key.m_i1 == ptr->m_twin->m_incidentVertex)) ||
					((key.m_i1 == ptr->m_incidentVertex) && (key.m_i0 == ptr->m_twin->m_incidentVertex))) {
						break;
				}
			}
			if (!node) {
				dgDiagonalEdge key (ptr);
				dignonals.Append(key);
			}
		}
	}

	dgEdge* const face = perimeter[0];
	hacd::HaI32 i0 = face->m_incidentVertex * stride;
	hacd::HaI32 i1 = face->m_next->m_incidentVertex * stride;
	dgBigVector p0 (vertex[i0], vertex[i0 + 1], vertex[i0 + 2], hacd::HaF32 (0.0f));
	dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF32 (0.0f));

	dgBigVector p1p0 (p1 - p0);
	hacd::HaF64 mag2 = p1p0 % p1p0;
	for (dgEdge* ptr = face->m_next->m_next; mag2 < hacd::HaF32 (1.0e-12f); ptr = ptr->m_next) {
		hacd::HaI32 i1 = ptr->m_incidentVertex * stride;
		dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF32 (0.0f));
		p1p0 = p1 - p0;
		mag2 = p1p0 % p1p0;
	}

	dgMatrix matrix (dgGetIdentityMatrix());
	matrix.m_posit = p0;
	matrix.m_front = dgVector (p1p0.Scale (hacd::HaF64 (1.0f) / sqrt (mag2)));
	matrix.m_right = dgVector (normal->Scale (hacd::HaF64 (1.0f) / sqrt (*normal % *normal)));
	matrix.m_up = matrix.m_right * matrix.m_front;
	matrix = matrix.Inverse();
	matrix.m_posit.m_w = hacd::HaF32 (1.0f);

	hacd::HaI32 maxCount = dignonals.GetCount() * dignonals.GetCount();
	while (dignonals.GetCount() && maxCount) {
		maxCount --;
		dgList<dgDiagonalEdge>::dgListNode* const node = dignonals.GetFirst();
		dgDiagonalEdge key (node->GetInfo());
		dignonals.Remove(node);
		dgEdge* const edge = FindEdge(key.m_i0, key.m_i1);
		if (edge) {
			hacd::HaI32 i0 = edge->m_incidentVertex * stride;
			hacd::HaI32 i1 = edge->m_next->m_incidentVertex * stride;
			hacd::HaI32 i2 = edge->m_next->m_next->m_incidentVertex * stride;
			hacd::HaI32 i3 = edge->m_twin->m_prev->m_incidentVertex * stride;

			dgBigVector p0 (vertex[i0], vertex[i0 + 1], vertex[i0 + 2], hacd::HaF64 (0.0f));
			dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF64 (0.0f));
			dgBigVector p2 (vertex[i2], vertex[i2 + 1], vertex[i2 + 2], hacd::HaF64 (0.0f));
			dgBigVector p3 (vertex[i3], vertex[i3 + 1], vertex[i3 + 2], hacd::HaF64 (0.0f));

			p0 = matrix.TransformVector(p0);
			p1 = matrix.TransformVector(p1);
			p2 = matrix.TransformVector(p2);
			p3 = matrix.TransformVector(p3);

			hacd::HaF64 circleTest[3][3];
			circleTest[0][0] = p0[0] - p3[0];
			circleTest[0][1] = p0[1] - p3[1];
			circleTest[0][2] = circleTest[0][0] * circleTest[0][0] + circleTest[0][1] * circleTest[0][1];

			circleTest[1][0] = p1[0] - p3[0];
			circleTest[1][1] = p1[1] - p3[1];
			circleTest[1][2] = circleTest[1][0] * circleTest[1][0] + circleTest[1][1] * circleTest[1][1];

			circleTest[2][0] = p2[0] - p3[0];
			circleTest[2][1] = p2[1] - p3[1];
			circleTest[2][2] = circleTest[2][0] * circleTest[2][0] + circleTest[2][1] * circleTest[2][1];

			hacd::HaF64 error;
			hacd::HaF64 det = Determinant3x3 (circleTest, &error);
			if (det < hacd::HaF32 (0.0f)) {
				dgEdge* frontFace0 = edge->m_prev;
				dgEdge* backFace0 = edge->m_twin->m_prev;

				FlipEdge(edge);

				if (perimeterCount > 4) {
					dgEdge* backFace1 = backFace0->m_next;
					dgEdge* frontFace1 = frontFace0->m_next;
					for (hacd::HaI32 i = 0; i < perimeterCount; i ++) {
						if (frontFace0 == perimeter[i]) {
							frontFace0 = NULL;
						}
						if (frontFace1 == perimeter[i]) {
							frontFace1 = NULL;
						}

						if (backFace0 == perimeter[i]) {
							backFace0 = NULL;
						}
						if (backFace1 == perimeter[i]) {
							backFace1 = NULL;
						}
					}

					if (backFace0 && (backFace0->m_incidentFace > 0) && (backFace0->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (backFace0);
						dignonals.Append(key);
					}
					if (backFace1 && (backFace1->m_incidentFace > 0) && (backFace1->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (backFace1);
						dignonals.Append(key);
					}

					if (frontFace0 && (frontFace0->m_incidentFace > 0) && (frontFace0->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (frontFace0);
						dignonals.Append(key);
					}

					if (frontFace1 && (frontFace1->m_incidentFace > 0) && (frontFace1->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (frontFace1);
						dignonals.Append(key);
					}
				}
			}
		}
	}
}